

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileData.h
# Opt level: O0

void __thiscall Assimp::ObjFile::Mesh::~Mesh(Mesh *this)

{
  Face *this_00;
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<Assimp::ObjFile::Face_**,_std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>_>
  local_20;
  __normal_iterator<Assimp::ObjFile::Face_**,_std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>_>
  local_18;
  iterator it;
  Mesh *this_local;
  
  it._M_current = (Face **)this;
  local_18._M_current =
       (Face **)std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
                begin(&this->m_Faces);
  while( true ) {
    local_20._M_current =
         (Face **)std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::
                  end(&this->m_Faces);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<Assimp::ObjFile::Face_**,_std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppFVar2;
    if (this_00 != (Face *)0x0) {
      ObjFile::Face::~Face(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ObjFile::Face_**,_std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::~vector
            (&this->m_Faces);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Mesh() {
        for (std::vector<Face*>::iterator it = m_Faces.begin();
            it != m_Faces.end(); ++it)
        {
            delete *it;
        }
    }